

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O1

void __thiscall
gimage::TIFFImageIO::loadHeader(TIFFImageIO *this,char *name,long *width,long *height,int *depth)

{
  long lVar1;
  IOException *this_00;
  long *plVar2;
  size_type *psVar3;
  uint32_t w;
  uint16_t d;
  uint32_t h;
  allocator local_99;
  uint *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = (uint *)depth;
  lVar1 = TIFFOpen(name,"r");
  if (lVar1 != 0) {
    TIFFGetField(lVar1,0x100,&local_90);
    TIFFGetField(lVar1,0x101,&local_50);
    TIFFGetField(lVar1,0x115,&local_70);
    *width = (ulong)local_90._M_dataplus._M_p & 0xffffffff;
    *height = (ulong)(uint)local_50._M_dataplus._M_p;
    *local_98 = (uint)(ushort)local_70._M_dataplus._M_p;
    TIFFClose(lVar1);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_70,name,&local_99);
  std::operator+(&local_50,"Can only load TIFF image (",&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar3) {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90.field_2._8_8_ = plVar2[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar3;
  }
  local_90._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  gutil::IOException::IOException(this_00,&local_90);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void TIFFImageIO::loadHeader(const char *name, long &width, long &height, int &depth) const
{
  TIFF *tif=TIFFOpen(name, "r");

  if (tif == 0)
  {
    throw gutil::IOException("Can only load TIFF image ("+std::string(name)+")");
  }

  uint32_t w, h;
  uint16_t d;

  TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &w);
  TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &h);
  TIFFGetField(tif, TIFFTAG_SAMPLESPERPIXEL, &d);

  width=w;
  height=h;
  depth=d;

  TIFFClose(tif);
}